

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# characterproperties.cpp
# Opt level: O0

UCPMap * u_getIntPropertyMap_63(UProperty property,UErrorCode *pErrorCode)

{
  UBool UVar1;
  UCPMap *local_30;
  UCPMap *map;
  Mutex m;
  UErrorCode *pErrorCode_local;
  UCPMap *pUStack_10;
  UProperty property_local;
  
  m.fMutex = (UMutex *)pErrorCode;
  UVar1 = U_FAILURE(*pErrorCode);
  if (UVar1 == '\0') {
    if ((property < UCHAR_BIDI_CLASS) || (UCHAR_VERTICAL_ORIENTATION < property)) {
      ((m.fMutex)->fMutex).__data.__lock = 1;
      pUStack_10 = (UCPMap *)0x0;
    }
    else {
      icu_63::Mutex::Mutex((Mutex *)&map,(UMutex *)(anonymous_namespace)::cpMutex);
      local_30 = *(UCPMap **)((anonymous_namespace)::maps + (long)(property + 0xfffff000) * 8);
      if (local_30 == (UCPMap *)0x0) {
        local_30 = anon_unknown.dwarf_2d59d0::makeMap(property,(UErrorCode *)m.fMutex);
        *(UCPMap **)((anonymous_namespace)::maps + (long)(property + 0xfffff000) * 8) = local_30;
      }
      pUStack_10 = local_30;
      icu_63::Mutex::~Mutex((Mutex *)&map);
    }
  }
  else {
    pUStack_10 = (UCPMap *)0x0;
  }
  return pUStack_10;
}

Assistant:

U_CAPI const UCPMap * U_EXPORT2
u_getIntPropertyMap(UProperty property, UErrorCode *pErrorCode) {
    if (U_FAILURE(*pErrorCode)) { return nullptr; }
    if (property < UCHAR_INT_START || UCHAR_INT_LIMIT <= property) {
        *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return nullptr;
    }
    Mutex m(&cpMutex);
    UCPMap *map = maps[property - UCHAR_INT_START];
    if (map == nullptr) {
        maps[property - UCHAR_INT_START] = map = makeMap(property, *pErrorCode);
    }
    return map;
}